

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

void print_boolean_expr(BoolExpr *be)

{
  BoolExpr *local_10;
  BoolExpr *be_local;
  
  switch(be->type) {
  case E_FALSE:
    printf("false ");
    break;
  case E_TRUE:
    printf("true ");
    break;
  case E_UNKNOWN:
    printf("? ");
    break;
  case E_AND:
    printf("(and ");
    for (local_10 = be->subexpr; local_10 != (BoolExpr *)0x0; local_10 = local_10->next) {
      print_boolean_expr(local_10);
    }
    printf(") ");
    break;
  case E_OR:
    printf("(or ");
    for (local_10 = be->subexpr; local_10 != (BoolExpr *)0x0; local_10 = local_10->next) {
      print_boolean_expr(local_10);
    }
    printf(") ");
    break;
  case E_XOR:
    printf("(xor ");
    for (local_10 = be->subexpr; local_10 != (BoolExpr *)0x0; local_10 = local_10->next) {
      print_boolean_expr(local_10);
    }
    printf(") ");
    break;
  case E_NOT:
    printf("(not ");
    print_boolean_expr(be->subexpr);
    printf(") ");
  }
  return;
}

Assistant:

void
print_boolean_expr (const BoolExpr *be)
{
  switch (be->type) {
  case E_TRUE:    printf ("true ");   break;
  case E_FALSE:   printf ("false ");   break;
  case E_UNKNOWN: printf ("? ");    break;
  case E_NOT:
    printf ("(not ");
    print_boolean_expr (be->subexpr);
    printf (") ");
    break;
  case E_AND:
    printf ("(and ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  case E_OR:
    printf ("(or ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  case E_XOR:
    printf ("(xor ");
    for (be=be->subexpr; be != NULL; be=be->next)
      print_boolean_expr (be);
    printf (") ");
    break;
  }
}